

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O1

void fmt::internal::report_unknown_type(char code,char *type)

{
  int iVar1;
  runtime_error *this;
  byte in_DIL;
  char **in_R8;
  byte local_49;
  uint local_48 [3];
  int local_3c;
  string local_38;
  
  local_49 = in_DIL;
  iVar1 = isprint((uint)in_DIL);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  if (iVar1 == 0) {
    local_3c = (int)(char)local_49;
    format<unsigned_int,char_const*>
              (&local_38,(fmt *)"unknown format code \'\\x{:02x}\' for {}",(CStringRef)&local_3c,
               local_48,in_R8);
    std::runtime_error::runtime_error(this,local_38._M_dataplus._M_p);
    *(undefined ***)this = &PTR__runtime_error_001b0878;
    __cxa_throw(this,&FormatError::typeinfo,std::runtime_error::~runtime_error);
  }
  format<char,char_const*>
            (&local_38,(fmt *)"unknown format code \'{}\' for {}",(CStringRef)&local_49,
             (char *)local_48,in_R8);
  std::runtime_error::runtime_error(this,local_38._M_dataplus._M_p);
  *(undefined ***)this = &PTR__runtime_error_001b0878;
  __cxa_throw(this,&FormatError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

FMT_FUNC void internal::report_unknown_type(char code, const char *type) {
  (void)type;
  if (std::isprint(static_cast<unsigned char>(code))) {
    FMT_THROW(FormatError(
        format("unknown format code '{}' for {}", code, type)));
  }
  FMT_THROW(FormatError(
      format("unknown format code '\\x{:02x}' for {}",
        static_cast<unsigned>(code), type)));
}